

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::
BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test::TestBody
          (BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test
           *this)

{
  bool bVar1;
  reference piVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  duration<long,_std::ratio<1L,_1000L>_> local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  duration elapsed;
  time_point time_now;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  milliseconds local_140;
  iterator local_138;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  int local_ec;
  duration<long,_std::ratio<1L,_1000L>_> local_e8;
  int local_dc;
  BlockingQueue<int> *local_d8;
  thread local_d0;
  thread thread;
  BlockingQueue<int> queue;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point start_time;
  BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test *this_local;
  
  start_time.__d.__r = (duration)(duration)this;
  local_18.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  thread._M_id._M_thread = (id)0;
  BlockingQueue<int>::BlockingQueue((BlockingQueue<int> *)&thread);
  local_dc = 1;
  local_ec = 500;
  local_d8 = (BlockingQueue<int> *)&thread;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_e8,&local_ec);
  std::thread::
  thread<void(&)(bidfx_public_api::tools::BlockingQueue<int>*,int,std::chrono::duration<long,std::ratio<1l,1000l>>),bidfx_public_api::tools::BlockingQueue<int>*,int,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_d0,PushToIntBlockingQueueAfterSleep,&local_d8,&local_dc,&local_e8);
  local_144 = 1000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_140,&local_144);
  BlockingQueue<int>::Poll(&local_138,(BlockingQueue<int> *)&thread,local_140);
  piVar2 = std::_Deque_iterator<int,_int_&,_int_*>::operator*(&local_138);
  local_111 = *piVar2 == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&time_now,(internal *)local_110,
               (AssertionResult *)"*queue.Poll(std::chrono::milliseconds(1000)) == 1","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/blocking_queue_test.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&time_now);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  elapsed.__r = std::chrono::_V2::system_clock::now();
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&elapsed,&local_18);
  local_1a4 = 600;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_1a0,&local_1a4);
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((internal *)local_198,"elapsed","std::chrono::milliseconds(600)",
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&gtest_ar.message_,&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/blocking_queue_test.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::thread::join();
  std::thread::~thread(&local_d0);
  BlockingQueue<int>::~BlockingQueue((BlockingQueue<int> *)&thread);
  return;
}

Assistant:

TEST(BlockingQueueTest, test_poll_will_block_until_second_thread_pushes_to_empty_queue)
{
    std::chrono::high_resolution_clock::time_point start_time = std::chrono::high_resolution_clock::now();
    BlockingQueue<int> queue = BlockingQueue<int>();

    std::thread thread(PushToIntBlockingQueueAfterSleep, &queue, 1, std::chrono::milliseconds(500));
    EXPECT_TRUE(*queue.Poll(std::chrono::milliseconds(1000)) == 1);

    std::chrono::high_resolution_clock::time_point time_now = std::chrono::high_resolution_clock::now();
    std::chrono::high_resolution_clock::duration elapsed = time_now - start_time;
    EXPECT_LT(elapsed, std::chrono::milliseconds(600));

    thread.join();
}